

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_oram.h
# Opt level: O0

void __thiscall TreeOram::TreeOram(TreeOram *this,int _logN,int buck_size,int _h)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  reference ppBVar4;
  undefined4 in_ECX;
  undefined4 in_ESI;
  Bucket<int> *in_RDI;
  uint i_1;
  int i;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  result_type in_stack_ffffffffffffff64;
  result_type_conflict in_stack_ffffffffffffff68;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffff70;
  Bucket<int> *this_00;
  uint local_50;
  int local_3c;
  undefined8 local_2c;
  
  std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>::vector
            ((vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_> *)0x10a06e);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10a081);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x10a08f);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)0x10a0a2);
  time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  *(undefined4 *)
   ((long)&in_RDI[0x9e].blocks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = in_ESI;
  *(undefined4 *)
   &in_RDI[0x9e].blocks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = in_ECX;
  *(int *)&in_RDI[0x9e].blocks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start =
       1 << (*(byte *)((long)&in_RDI[0x9e].blocks.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start + 4) & 0x1f);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c
             ,in_stack_ffffffffffffff58);
  *(undefined8 *)&in_RDI[0x9d].bsize = local_2c;
  operator_new(0x20);
  Bucket<int>::Bucket((Bucket<int> *)in_stack_ffffffffffffff70,
                      (int)(in_stack_ffffffffffffff68 >> 0x20));
  std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>::push_back
            ((vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (value_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  for (local_3c = 1;
      local_3c <
      1 << ((byte)*(undefined4 *)
                   &in_RDI[0x9e].blocks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish & 0x1f); local_3c = local_3c + 1) {
    this_00 = in_RDI;
    operator_new(0x20);
    Bucket<int>::Bucket(this_00,(int)(in_stack_ffffffffffffff68 >> 0x20));
    std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>::push_back
              ((vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (value_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(value_type *)0x10a275);
  local_50 = 0;
  while( true ) {
    uVar1 = (ulong)local_50;
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)&in_RDI->bsize);
    if (sVar2 <= uVar1) break;
    in_stack_ffffffffffffff64 =
         std::uniform_int_distribution<int>::operator()
                   ((uniform_int_distribution<int> *)
                    CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&in_RDI->bsize,(ulong)local_50);
    *pvVar3 = in_stack_ffffffffffffff64;
    local_50 = local_50 + 1;
  }
  ppBVar4 = std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>::operator[]
                      ((vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_> *)in_RDI,0);
  in_RDI[0x9e].blocks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)*ppBVar4;
  return;
}

Assistant:

TreeOram(int _logN, int buck_size, int _h)
      {
         rg.seed(time(0));
         logN = _logN;
         h = _h;
         N = 1<<logN;
         uni = std::uniform_int_distribution<int>(0, (1<<(h-1))-1);
         tree.push_back(new Bucket<int>(STASH_CAP));
         for(int i = 1; i < 1<<h; ++i)
            tree.push_back(new Bucket<int>(buck_size));
         index.assign(N+1, -1);
         for(unsigned int i = 0; i < index.size(); ++i)
            index[i] = uni(rg);
         stash = tree[0];
      }